

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg_status.hpp
# Opt level: O3

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,mrg_status<int,_3,_trng::mrg3s> *S
                )

{
  undefined4 uVar1;
  long lVar2;
  mrg_status<int,_3,_trng::mrg3s> S_new;
  delim_c local_37;
  delim_c local_36;
  delim_c local_35;
  undefined8 local_34;
  int local_2c;
  
  local_34 = 0x100000000;
  local_2c = 1;
  uVar1 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  local_35.c = '(';
  utility::operator>>(in,&local_35);
  lVar2 = 0;
  do {
    std::istream::operator>>((istream *)in,(int *)((long)&local_34 + lVar2));
    if (lVar2 == 8) break;
    local_37.c = ' ';
    utility::operator>>(in,&local_37);
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0xc);
  local_36.c = ')';
  utility::operator>>(in,&local_36);
  lVar2 = *(long *)(*(long *)in + -0x18);
  if (((byte)in[lVar2 + 0x20] & 5) == 0) {
    S->r[2] = local_2c;
    *(undefined8 *)S->r = local_34;
    lVar2 = *(long *)(*(long *)in + -0x18);
  }
  *(undefined4 *)(in + lVar2 + 0x18) = uVar1;
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
        std::basic_istream<char_t, traits_t> &in, mrg_status &S) {
      mrg_status S_new;
      std::ios_base::fmtflags flags(in.flags());
      in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
      in >> utility::delim('(');
      for (int i{0}; i < n; ++i) {
        in >> S_new.r[i];
        if (i + 1 < n)
          in >> utility::delim(' ');
      }
      in >> utility::delim(')');
      if (in)
        S = S_new;
      in.flags(flags);
      return in;
    }